

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O2

bool chrono::utils::AddTriangleMeshConvexDecompositionV2
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,string *obj_filename,
               string *name,ChVector<double> *pos,ChQuaternion<double> *rot,bool use_original_asset,
               shared_ptr<chrono::ChVisualMaterial> vis_material)

{
  double *pdVar1;
  double dVar2;
  pointer pCVar3;
  double dVar4;
  element_type *peVar5;
  undefined8 uVar6;
  _func_int **pp_Var7;
  element_type *peVar8;
  uint uVar9;
  int iVar10;
  ostream *poVar11;
  bool bVar12;
  int i;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> convexhull;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh_convex;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  undefined1 local_3a8 [48];
  shared_ptr<chrono::ChVisualShape> local_378;
  undefined1 local_368 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  __shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> local_348;
  __shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> local_338 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_330;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> local_328;
  __shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> local_318;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_308;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_2f8;
  ChQuaternion<double> local_2e8;
  ChConvexDecompositionHACDv2 mydecompositionHACDv2;
  ChFrame<double> local_240;
  shared_ptr<chrono::ChVisualModel> model;
  double local_1a8 [47];
  
  local_3a8._40_8_ = material;
  ChPhysicsItem::GetVisualModel((ChPhysicsItem *)&model);
  peVar8 = model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (peVar8 == (element_type *)0x0) {
    std::make_shared<chrono::ChVisualModel>();
    std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_2f8,
               &model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>);
    ChPhysicsItem::AddVisualModel
              (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)&local_2f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2f8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  bVar12 = false;
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)&trimesh,obj_filename,true,false);
  if (trimesh.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    lVar15 = 0;
    for (uVar14 = 0;
        pCVar3 = ((trimesh.
                   super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->m_vertices).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar14 < (ulong)(((long)((trimesh.
                                  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->m_vertices).
                                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0x18);
        uVar14 = uVar14 + 1) {
      ChQuaternion<double>::Rotate(rot,(ChVector<double> *)((long)pCVar3->m_data + lVar15));
      dVar2 = pos->m_data[2];
      dVar4 = pos->m_data[1];
      pCVar3 = ((trimesh.
                 super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->m_vertices).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar1 = (double *)((long)pCVar3->m_data + lVar15);
      *pdVar1 = pos->m_data[0] +
                (double)model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
      pdVar1[1] = dVar4 + (double)model.
                                  super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi;
      *(double *)((long)pCVar3->m_data + lVar15 + 0x10) = dVar2 + local_1a8[0];
      lVar15 = lVar15 + 0x18;
    }
    collision::ChConvexDecompositionHACDv2::ChConvexDecompositionHACDv2(&mydecompositionHACDv2);
    collision::ChConvexDecompositionHACDv2::Reset(&mydecompositionHACDv2);
    collision::ChConvexDecompositionHACDv2::AddTriangleMesh
              (&mydecompositionHACDv2,
               &(trimesh.
                 super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super_ChTriangleMesh);
    collision::ChConvexDecompositionHACDv2::SetParameters
              (&mydecompositionHACDv2,0x400,0x100,0x40,0.01,0.0,1e-06);
    collision::ChConvexDecompositionHACDv2::ComputeConvexDecomposition(&mydecompositionHACDv2);
    local_3a8._24_8_ = pos;
    uVar9 = (*mydecompositionHACDv2.super_ChConvexDecomposition._vptr_ChConvexDecomposition[7])();
    local_3a8._32_8_ = &body->collision_model;
    for (uVar13 = 0; (~((int)uVar9 >> 0x1f) & uVar9) != uVar13; uVar13 = uVar13 + 1) {
      convexhull.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      convexhull.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      convexhull.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar10 = (*mydecompositionHACDv2.super_ChConvexDecomposition._vptr_ChConvexDecomposition[9])
                         (&mydecompositionHACDv2,(ulong)uVar13,&convexhull);
      if ((char)iVar10 == '\0') {
LAB_00e33a53:
        std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
        ~_Vector_base(&convexhull.
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     );
        goto LAB_00e33a5d;
      }
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_240,
                   (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   local_3a8._32_8_);
      pp_Var7 = local_240._vptr_ChFrame;
      std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_308,
                 (__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *)
                 local_3a8._40_8_);
      ChMatrix33<double>::Set_A_quaternion((ChMatrix33<double> *)&model,rot);
      (**(code **)(*pp_Var7 + 0x78))
                (pp_Var7,&local_308,&convexhull,local_3a8._24_8_,(stringstream *)&model);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_308._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_240.coord);
      if (!use_original_asset) {
        std::__cxx11::stringstream::stringstream((stringstream *)&model);
        poVar11 = std::operator<<((ostream *)local_1a8,(string *)name);
        poVar11 = std::operator<<(poVar11,"_");
        std::ostream::operator<<(poVar11,uVar13);
        std::make_shared<chrono::geometry::ChTriangleMeshConnected>();
        iVar10 = (*mydecompositionHACDv2.super_ChConvexDecomposition._vptr_ChConvexDecomposition[8])
                           (&mydecompositionHACDv2,(ulong)uVar13,
                            trimesh_convex.
                            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
        if ((char)iVar10 == '\0') {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&trimesh_convex.
                      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__cxx11::stringstream::~stringstream((stringstream *)&model);
          goto LAB_00e33a53;
        }
        chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
        peVar5 = trimesh_shape.
                 super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_318,
                     &trimesh_convex.
                      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                    );
        ChTriangleMeshShape::SetMesh
                  (peVar5,(shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)&local_318,true);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_318._M_refcount);
        peVar5 = trimesh_shape.
                 super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&peVar5->name);
        std::__cxx11::string::~string((string *)&local_240);
        peVar5 = trimesh_shape.
                 super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_328,
                   (__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *)
                   vis_material.
                   super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        ChVisualShape::AddMaterial
                  (&peVar5->super_ChVisualShape,(shared_ptr<chrono::ChVisualMaterial> *)&local_328);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_328._M_refcount);
        ChPhysicsItem::GetVisualModel((ChPhysicsItem *)local_368);
        uVar6 = local_368._0_8_;
        std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::ChTriangleMeshShape,void>
                  (local_338,
                   &trimesh_shape.
                    super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>);
        local_3a8._16_8_ = (pointer)0x0;
        local_2e8.m_data[0] = (double)&DAT_3ff0000000000000;
        local_2e8.m_data[3] = 0.0;
        local_3a8._0_8_ = (ChVisualModel *)0x0;
        local_3a8._8_8_ = (pointer)0x0;
        local_2e8.m_data[1] = 0.0;
        local_2e8.m_data[2] = 0.0;
        ChFrame<double>::ChFrame(&local_240,(ChVector<double> *)local_3a8,&local_2e8);
        ChVisualModel::AddShape
                  ((ChVisualModel *)uVar6,(shared_ptr<chrono::ChVisualShape> *)local_338,&local_240)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_330);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_368 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&trimesh_shape.
                    super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&trimesh_convex.
                    super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__cxx11::stringstream::~stringstream((stringstream *)&model);
      }
      std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
      ~_Vector_base(&convexhull.
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   );
    }
    if (use_original_asset) {
      chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
      pCVar3 = convexhull.
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_348,
                   &trimesh.
                    super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                  );
      ChTriangleMeshShape::SetMesh
                ((ChTriangleMeshShape *)pCVar3,
                 (shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)&local_348,true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_348._M_refcount);
      std::__cxx11::string::_M_assign
                ((string *)
                 (convexhull.
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[2].m_data + 2));
      pCVar3 = convexhull.
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_368 + 0x10),
                 (__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *)
                 vis_material.
                 super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      ChVisualShape::AddMaterial
                ((ChVisualShape *)pCVar3,(shared_ptr<chrono::ChVisualMaterial> *)(local_368 + 0x10))
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_350);
      ChPhysicsItem::GetVisualModel((ChPhysicsItem *)local_3a8);
      uVar6 = local_3a8._0_8_;
      std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChTriangleMeshShape,void>
                ((__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> *)&local_378,
                 (__shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2> *)
                 &convexhull);
      local_240._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
      local_2e8.m_data[2] = 0.0;
      local_240.coord.pos.m_data[2] = 0.0;
      local_2e8.m_data[0] = 0.0;
      local_2e8.m_data[1] = 0.0;
      local_240.coord.pos.m_data[0] = 0.0;
      local_240.coord.pos.m_data[1] = 0.0;
      ChFrame<double>::ChFrame
                ((ChFrame<double> *)&model,(ChVector<double> *)&local_2e8,
                 (ChQuaternion<double> *)&local_240);
      ChVisualModel::AddShape((ChVisualModel *)uVar6,&local_378,(ChFrame<double> *)&model);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_378.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3a8 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &convexhull.
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
    }
LAB_00e33a5d:
    bVar12 = (int)uVar9 <= (int)uVar13;
    collision::ChConvexDecompositionHACDv2::~ChConvexDecompositionHACDv2(&mydecompositionHACDv2);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trimesh.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return bVar12;
}

Assistant:

bool AddTriangleMeshConvexDecompositionV2(ChBody* body,
                                          std::shared_ptr<ChMaterialSurface> material,
                                          const std::string& obj_filename,
                                          const std::string& name,
                                          const ChVector<>& pos,
                                          const ChQuaternion<>& rot,
                                          bool use_original_asset,
                                          std::shared_ptr<ChVisualMaterial> vis_material) {
    if (!body->GetVisualModel()) {
        auto model = chrono_types::make_shared<ChVisualModel>();
        body->AddVisualModel(model);
    }

    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(obj_filename, true, false);
    if (!trimesh)
        return false;

    for (int i = 0; i < trimesh->m_vertices.size(); i++) {
        trimesh->m_vertices[i] = pos + rot.Rotate(trimesh->m_vertices[i]);
    }
    collision::ChConvexDecompositionHACDv2 mydecompositionHACDv2;

    int hacd_maxhullcount = 1024;
    int hacd_maxhullmerge = 256;
    int hacd_maxhullvertexes = 64;
    double hacd_concavity = 0.01;
    double hacd_smallclusterthreshold = 0.0;
    double hacd_fusetolerance = 1e-6;

    mydecompositionHACDv2.Reset();
    mydecompositionHACDv2.AddTriangleMesh(*trimesh);

    mydecompositionHACDv2.SetParameters(hacd_maxhullcount, hacd_maxhullmerge, hacd_maxhullvertexes,
                                        (float)hacd_concavity, (float)hacd_smallclusterthreshold,
                                        (float)hacd_fusetolerance);
    mydecompositionHACDv2.ComputeConvexDecomposition();
    collision::ChConvexDecomposition* used_decomposition = &mydecompositionHACDv2;

    int hull_count = used_decomposition->GetHullCount();

    for (int c = 0; c < hull_count; c++) {
        std::vector<ChVector<double>> convexhull;
        if (!used_decomposition->GetConvexHullResult(c, convexhull))
            return false;

        body->GetCollisionModel()->AddConvexHull(material, convexhull, pos, rot);
        if (!use_original_asset) {
            std::stringstream ss;
            ss << name << "_" << c;
            auto trimesh_convex = chrono_types::make_shared<geometry::ChTriangleMeshConnected>();
            if (!used_decomposition->GetConvexHullResult(c, *trimesh_convex))
                return false;

            auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
            trimesh_shape->SetMesh(trimesh_convex);
            trimesh_shape->SetName(ss.str());
            trimesh_shape->AddMaterial(vis_material);
            body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
        }
    }
    if (use_original_asset) {
        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh);
        trimesh_shape->SetName(name);
        trimesh_shape->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
    }

    return true;
}